

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  MutexLock lock;
  
  if (type != (Descriptor *)0x0) {
    lock.mu_ = &this->prototypes_mutex_;
    absl::lts_20240722::Mutex::Lock();
    pMVar1 = GetPrototypeNoLock(this,type);
    absl::lts_20240722::MutexLock::~MutexLock(&lock);
    return pMVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&lock,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/dynamic_message.cc"
             ,0x290,0xf,"type != nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&lock);
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  ABSL_CHECK(type != nullptr);
  absl::MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}